

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphic.h
# Opt level: O2

int __thiscall
mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::add
          (updates<const_mpt::convertable_*,_mpt::graphic::hint> *this,convertable **d,hint *h)

{
  updates<const_mpt::convertable_*,_mpt::graphic::hint> uVar1;
  char cVar2;
  long lVar3;
  undefined8 *puVar4;
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  hint *phVar8;
  bool bVar9;
  
  uVar1 = *this;
  if (uVar1 == (updates<const_mpt::convertable_*,_mpt::graphic::hint>)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    if (*(long *)((long)uVar1 + 8) == 0) {
      lVar5 = (long)uVar1 + 0x20;
    }
  }
  lVar3 = length(this);
  if (lVar3 < 1) {
    lVar3 = 0;
  }
  phVar8 = (hint *)(lVar5 + 8);
  lVar7 = lVar3;
  while( true ) {
    bVar9 = lVar7 == 0;
    lVar7 = lVar7 + -1;
    if (bVar9) {
      lVar3 = lVar3 + 1;
      puVar4 = (undefined8 *)(lVar5 + -0x10);
      do {
        puVar6 = puVar4;
        lVar3 = lVar3 + -1;
        if (lVar3 == 0) {
          puVar4 = (undefined8 *)mpt::array::append((ulong)this,(void *)0x10);
          if (puVar4 != (undefined8 *)0x0) {
            *puVar4 = *d;
            *(undefined4 *)(puVar4 + 1) = *(undefined4 *)h;
            *(undefined4 *)((long)puVar4 + 0xc) = 1;
            return 2;
          }
          return -4;
        }
        puVar4 = puVar6 + 2;
      } while (*(int *)((long)puVar6 + 0x1c) != 0);
      puVar6[2] = *d;
      *(undefined4 *)(puVar6 + 3) = *(undefined4 *)h;
      *(undefined4 *)((long)puVar6 + 0x1c) = 1;
      return 0;
    }
    if (((*(int *)(phVar8 + 4) != 0) && (*d == *(convertable **)(phVar8 + -8))) &&
       (cVar2 = mpt::graphic::hint::merge(phVar8,(int)h), cVar2 != '\0')) break;
    phVar8 = phVar8 + 0x10;
  }
  *(int *)(phVar8 + 4) = *(int *)(phVar8 + 4) + 1;
  return 1;
}

Assistant:

int add(const T &d, const H &h = H())
	{
		element *cmp = static_cast<element *>(base());
		long max = length();
		for (long i = 0; i < max; ++i) {
			if (!cmp[i].used) {
				continue;
			}
			// different data elements
			if (d != cmp[i].data) {
				continue;
			}
			if (cmp[i].hint.merge(h)) {
				++cmp[i].used;
				return 1;
			}
		}
		for (long i = 0; i < max; ++i) {
			if (!cmp[i].used) {
				new (cmp + i) element(d, h);
				return 0;
			}
		}
		if (!(cmp = static_cast<element *>(array::append(sizeof(*cmp))))) {
			return BadOperation;
		}
		new (cmp) element(d, h);
		return 2;
	}